

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void CConsole::ConModCommandAccess(IResult *pResult,void *pUser)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  CCommand *pCVar3;
  undefined8 uVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *format;
  char *pcVar5;
  long in_FS_OFFSET;
  char aBuf [128];
  undefined4 extraout_var_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
  pCVar3 = FindCommand((CConsole *)pUser,(char *)CONCAT44(extraout_var,iVar2),4);
  if (pCVar3 == (CCommand *)0x0) {
    iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
    str_format(aBuf,0x80,"No such command: \'%s\'.",CONCAT44(extraout_var_01,iVar2));
  }
  else {
    if (pResult->m_NumArgs == 2) {
      iVar2 = (*pResult->_vptr_IResult[2])(pResult,1);
      (pCVar3->super_CCommandInfo).m_AccessLevel = (uint)(0 < iVar2);
      iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
      uVar4 = CONCAT44(extraout_var_00,iVar2);
      pcVar5 = "enabled";
      if ((pCVar3->super_CCommandInfo).m_AccessLevel == 0) {
        pcVar5 = "disabled";
      }
      format = "moderator access for \'%s\' is now %s";
    }
    else {
      iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
      uVar4 = CONCAT44(extraout_var_02,iVar2);
      pcVar5 = "enabled";
      if ((pCVar3->super_CCommandInfo).m_AccessLevel == 0) {
        pcVar5 = "disabled";
      }
      format = "moderator access for \'%s\' is %s";
    }
    str_format(aBuf,0x80,format,uVar4,pcVar5);
  }
  (**(code **)(*pUser + 200))(pUser,0,"console",aBuf,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConsole::ConModCommandAccess(IResult *pResult, void *pUser)
{
	CConsole* pConsole = static_cast<CConsole *>(pUser);
	char aBuf[128];
	CCommand *pCommand = pConsole->FindCommand(pResult->GetString(0), CFGFLAG_SERVER);
	if(pCommand)
	{
		if(pResult->NumArguments() == 2)
		{
			pCommand->SetAccessLevel(pResult->GetInteger(1));
			str_format(aBuf, sizeof(aBuf), "moderator access for '%s' is now %s", pResult->GetString(0), pCommand->GetAccessLevel() ? "enabled" : "disabled");
		}
		else
			str_format(aBuf, sizeof(aBuf), "moderator access for '%s' is %s", pResult->GetString(0), pCommand->GetAccessLevel() ? "enabled" : "disabled");
	}
	else
		str_format(aBuf, sizeof(aBuf), "No such command: '%s'.", pResult->GetString(0));

	pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
}